

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fout.cpp
# Opt level: O0

void __thiscall spatial_region::scale_j(spatial_region *this,double scale)

{
  cellj ***pppcVar1;
  int *in_RDI;
  field3d<cellj> *in_XMM0_Qa;
  int k;
  int j;
  int i;
  int in_stack_ffffffffffffffbc;
  field3d<cellj> *this_00;
  int local_1c;
  int local_18;
  int local_14;
  
  for (local_14 = 0; local_14 < *in_RDI; local_14 = local_14 + 1) {
    for (local_18 = 0; local_18 < in_RDI[1]; local_18 = local_18 + 1) {
      for (local_1c = 0; local_1c < in_RDI[2]; local_1c = local_1c + 1) {
        this_00 = in_XMM0_Qa;
        pppcVar1 = field3d<cellj>::operator[](in_XMM0_Qa,in_stack_ffffffffffffffbc);
        (*pppcVar1)[local_18][local_1c].jx = (double)this_00 * (*pppcVar1)[local_18][local_1c].jx;
        pppcVar1 = field3d<cellj>::operator[](this_00,in_stack_ffffffffffffffbc);
        (*pppcVar1)[local_18][local_1c].jy = (double)in_XMM0_Qa * (*pppcVar1)[local_18][local_1c].jy
        ;
        pppcVar1 = field3d<cellj>::operator[](this_00,in_stack_ffffffffffffffbc);
        (*pppcVar1)[local_18][local_1c].jz = (double)in_XMM0_Qa * (*pppcVar1)[local_18][local_1c].jz
        ;
      }
    }
  }
  return;
}

Assistant:

void spatial_region::scale_j(const double scale) {
    for (int i = 0; i < nx; i++) {
        for (int j = 0; j < ny; j++) {
            for (int k = 0; k < nz; k++) {
                cj[i][j][k].jx *= scale;
                cj[i][j][k].jy *= scale;
                cj[i][j][k].jz *= scale;
            }
        }
    }
}